

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O2

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::_relax
          (WeightedDigraphSPAcyclic<int,_int> *this,WeightedDigraph<int,_int> *graph,Node *node)

{
  SymbolTable<int,_int> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *edge;
  pointer value;
  int new_weight;
  int to_vertex;
  int vertex;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  edges;
  int local_54;
  int local_50;
  int local_4c;
  _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  local_48;
  
  local_4c = (node->element).key;
  this_00 = &this->_weight_to;
  iVar2 = data_structures::SymbolTable<int,_int>::get(this_00,&local_4c);
  data_structures::
  SymbolTable<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::values((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)&local_48,&(node->element).value._table);
  value = local_48._M_impl.super__Vector_impl_data._M_start;
  do {
    if (value == local_48._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::~_Vector_base(&local_48);
      return;
    }
    local_50 = (value->to->element).key;
    local_54 = value->weight + iVar2;
    bVar1 = data_structures::SymbolTable<int,_int>::has(this_00,&local_50);
    if (bVar1) {
      iVar3 = data_structures::SymbolTable<int,_int>::get(this_00,&local_50);
      if (local_54 < iVar3) goto LAB_001059a6;
    }
    else {
LAB_001059a6:
      data_structures::SymbolTable<int,_int>::set(this_00,&local_50,&local_54);
      data_structures::
      SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
      ::set(&this->_edge_to,&local_50,value);
    }
    value = value + 1;
  } while( true );
}

Assistant:

void _relax(WeightedDigraph<T, Weight> &graph, Node* node) {
            auto vertex = node->element.key;
            auto weight = _weight_to.get(vertex);
            auto edges = node->element.value.adjEdges();
            for (auto &edge: edges) {
                auto to_vertex = edge.to->element.key;
                auto new_weight = weight + edge.weight;
                if (!_weight_to.has(to_vertex)) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                    continue;
                }
                if (_weight_to.get(to_vertex) > new_weight) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                }
            }
        }